

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetRepeatedMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index)

{
  int iVar1;
  LogMessage *pLVar2;
  MessageLite *pMVar3;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedMessage",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    if (this->extensions_offset_ == -1) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4ae);
      pLVar2 = LogMessage::operator<<(&local_68,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_69,pLVar2);
      LogMessage::~LogMessage(&local_68);
    }
    pMVar3 = ExtensionSet::GetRepeatedMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (long)this->extensions_offset_),*(int *)(field + 0x28),index);
  }
  else {
    iVar1 = this->offsets_
            [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
             -0x11111111];
    if (*(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + (long)iVar1) <= index) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                 ,0x338);
      pLVar2 = LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
      LogFinisher::operator=(&local_69,pLVar2);
      LogMessage::~LogMessage(&local_68);
    }
    pMVar3 = *(MessageLite **)
              (*(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar1) +
              (long)index * 8);
  }
  return (Message *)pMVar3;
}

Assistant:

const Message& GeneratedMessageReflection::GetRepeatedMessage(
    const Message& message, const FieldDescriptor* field, int index) const {
  USAGE_CHECK_ALL(GetRepeatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<const Message&>(
        GetExtensionSet(message).GetRepeatedMessage(field->number(), index));
  } else {
    return GetRaw<RepeatedPtrFieldBase>(message, field)
        .Get<GenericTypeHandler<Message> >(index);
  }
}